

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O1

int PVSearch(Situation *situation,int depth,int alpha,int beta,Movement *inspire)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined4 uVar7;
  Movement move_00;
  Movement hash_move;
  Movement move_01;
  bool bVar8;
  int iVar9;
  uint uVar10;
  clock_t cVar11;
  long lVar12;
  int iVar13;
  Movement *all_movements;
  Movement move_02;
  Movement move;
  Movement inspire_move;
  Movement good_move;
  int move_num;
  Movement move_list [128];
  int local_69c;
  Movement local_698;
  int local_68c;
  Situation *local_688;
  uint local_680;
  int local_67c;
  Movement local_678;
  Movement local_668;
  int local_658;
  int local_654;
  ulong local_650;
  ulong local_648;
  Movement *local_640;
  Movement local_638 [128];
  undefined6 uVar4;
  undefined5 uVar6;
  
  local_678.catc = '\0';
  local_678.movec = '\0';
  local_678._10_2_ = 0;
  local_678.from = '\0';
  local_678.to = '\0';
  local_678.capture = '\0';
  local_678._3_1_ = 0;
  local_678.value = 0;
  local_668.from = '\0';
  local_668.to = '\0';
  local_668.capture = '\0';
  local_668._3_1_ = 0;
  local_668.value = 0;
  local_668.catc = '\0';
  local_668.movec = '\0';
  local_668._10_2_ = 0;
  local_698.from = '\0';
  local_698.to = '\0';
  local_698.capture = '\0';
  local_698._3_1_ = 0;
  local_698.value = 0;
  local_698.catc = '\0';
  local_698.movec = '\0';
  local_698._10_2_ = 0;
  local_640 = inspire;
  if (depth < 1) {
    iVar9 = QuiescentSearch(situation,alpha,beta);
    return iVar9;
  }
  local_69c = beta;
  if (step + -10000 < beta) {
    local_69c = ReadHashTable(depth,alpha,beta,&local_698);
    if (local_69c < -9999 || local_69c == 0x100000) {
      local_688 = situation;
      if ((2 < depth) &&
         (move_00.to = local_698.to, move_00.from = local_698.from,
         move_00.capture = local_698.capture, move_00._3_1_ = local_698._3_1_,
         move_00.value = local_698.value, move_00.catc = local_698.catc,
         move_00.movec = local_698.movec, move_00._10_2_ = local_698._10_2_,
         bVar8 = MovementsLegal(move_00,situation), !bVar8)) {
        iVar9 = PVSearch(situation,(uint)depth >> 1,alpha,beta,&local_678);
        if (iVar9 <= alpha) {
          PVSearch(local_688,(uint)depth >> 1,-0x100000,beta,&local_678);
        }
        local_698.catc = local_678.catc;
        local_698.movec = local_678.movec;
        local_698._10_2_ = local_678._10_2_;
        local_698.from = local_678.from;
        local_698.to = local_678.to;
        local_698._2_6_ = local_678._2_6_;
        situation = local_688;
      }
      if ((isTimeLimit == false) && (cVar11 = clock(), cVar11 - StartTime < 0x9c41)) {
        iVar9 = -0x100000;
        local_654 = 0;
        hash_move.to = local_698.to;
        hash_move.from = local_698.from;
        hash_move.capture = local_698.capture;
        hash_move._3_1_ = local_698._3_1_;
        hash_move.value = local_698.value;
        hash_move.catc = local_698.catc;
        hash_move.movec = local_698.movec;
        hash_move._10_2_ = local_698._10_2_;
        all_movements = local_638;
        MoveSort(situation,&local_654,all_movements,hash_move,step);
        local_69c = alpha;
        if (local_654 < 1) {
          uVar10 = 1;
        }
        else {
          local_68c = depth + -1;
          local_67c = -beta;
          local_680 = (uint)CONCAT71((uint7)(uint3)((uint)local_67c >> 8),1);
          lVar12 = 0;
          local_648 = 0;
          local_650 = (ulong)(uint)depth;
          do {
            uVar1 = all_movements->from;
            uVar2 = all_movements->to;
            uVar3 = all_movements->capture;
            uVar5 = all_movements->field_0x3;
            uVar7 = all_movements->value;
            uVar6 = CONCAT41(uVar7,uVar5);
            uVar4 = CONCAT51(uVar6,uVar3);
            local_698.catc = all_movements->catc;
            local_698.movec = all_movements->movec;
            local_698._10_2_ = *(undefined2 *)&all_movements->field_0xa;
            local_698.from = uVar1;
            local_698.to = uVar2;
            local_698._2_6_ = uVar4;
            if (uVar1 != '\0' || uVar2 != '\0') {
              local_658 = iVar9;
              bVar8 = MakeAMove(situation,&local_698,false);
              situation = local_688;
              if (bVar8) {
                iVar13 = step + -10000;
              }
              else {
                if ((local_648 & 1) != 0) {
                  iVar9 = SearchCut(local_688,local_68c,-local_69c,false);
                  iVar13 = -iVar9;
                  if (beta <= iVar13 || SBORROW4(local_69c,iVar13) == local_69c + iVar9 < 0)
                  goto LAB_0010a8df;
                }
                iVar13 = PVSearch(situation,local_68c,local_67c,-local_69c,&local_678);
                iVar13 = -iVar13;
              }
LAB_0010a8df:
              UnMakeAMove(situation);
              if (beta <= iVar13) {
                iVar9 = (int)local_650;
                SetBestMove(&local_698,step,iVar9);
                move_01.to = local_698.to;
                move_01.from = local_698.from;
                move_01.capture = local_698.capture;
                move_01._3_1_ = local_698._3_1_;
                move_01.value = local_698.value;
                move_01.catc = local_698.catc;
                move_01.movec = local_698.movec;
                move_01._10_2_ = local_698._10_2_;
                SaveHashTable(iVar9,beta,'\x02',move_01);
                return beta;
              }
              iVar9 = local_658;
              if (local_658 < iVar13) {
                local_668.catc = local_698.catc;
                local_668.movec = local_698.movec;
                local_668._10_2_ = local_698._10_2_;
                local_668.to = local_698.to;
                local_668.from = local_698.from;
                local_668.capture = local_698.capture;
                local_668._3_1_ = local_698._3_1_;
                local_668.value = local_698.value;
                local_640->catc = local_698.catc;
                local_640->movec = local_698.movec;
                *(undefined2 *)&local_640->field_0xa = local_698._10_2_;
                local_640->from = local_698.from;
                local_640->to = local_698.to;
                local_640->capture = local_698.capture;
                local_640->field_0x3 = local_698._3_1_;
                local_640->value = local_698.value;
                iVar9 = iVar13;
                if (local_69c < iVar13) {
                  local_648 = CONCAT71((uint7)local_698._9_3_,1);
                  local_680 = 0;
                  local_69c = iVar13;
                }
              }
            }
            lVar12 = lVar12 + 1;
            all_movements = all_movements + 1;
          } while (lVar12 < local_654);
          depth = (int)local_650;
          uVar10 = local_680;
        }
        bVar8 = (uVar10 & 1) == 0;
        iVar13 = local_69c;
        if (bVar8) {
          SetBestMove(&local_668,step,depth);
          iVar13 = iVar9;
        }
        move_02.catc = local_668.catc;
        move_02.movec = local_668.movec;
        move_02._10_2_ = local_668._10_2_;
        move_02.from = local_668.from;
        move_02.to = local_668.to;
        move_02.capture = local_668.capture;
        move_02._3_1_ = local_668._3_1_;
        move_02.value = local_668.value;
        SaveHashTable(depth,iVar13,!bVar8,move_02);
      }
      else {
        isTimeLimit = true;
        local_69c = 0x100000;
      }
    }
  }
  return local_69c;
}

Assistant:

int PVSearch(Situation& situation, int depth, int alpha, int beta, Movement& inspire){
    int value;                      // 下一着法的分值
    int best;                       // 所有着法中的最佳分值
    Movement move_list[128];        // 当前所有着法
    Movement move;                  // 当前着法
    Movement good_move;             // 当前局面最佳着法
    Movement inspire_move;          // 内部迭代启发着法
    move = good_move = inspire_move = NONE_MOVE;

    // 到达搜索深度
    if(depth <= 0){
        // 静态搜索评估
        return QuiescentSearch(situation, alpha, beta);
    }

    if(step - MAX_VALUE >= beta)
        return beta;

    // 置换表裁剪
    value = ReadHashTable(depth, alpha, beta, move);
    if(value != NONE_VALUE && value > -MAX_VALUE){
        return value;
    }

    // 内部迭代加深启发(在置换表未能给出启发走法时使用)
    if(depth > 2 && !MovementsLegal(move, situation)){
        value = PVSearch(situation, depth / 2, alpha, beta, inspire_move);
        if(value <= alpha){
            value = PVSearch(situation, depth / 2, -NONE_VALUE, beta, inspire_move);
        }
        move = inspire_move;
    }

    // 时间检测，避免超限
    if(isTimeLimit || clock() - StartTime > MAX_TIME){
        isTimeLimit = 1;
        return NONE_VALUE;
    }
    
    best = -NONE_VALUE;
    bool isAlpha = true;    // 当前结点是否为Alpha结点
    bool PVflag = false;

    int move_num = 0;       // 着法数量
    // 生成着法
    MoveSort(situation, move_num, move_list, move, step);
    for(int i = 0; i < move_num; i++){
        move = move_list[i];
        if(move.from == 0 && move.to == 0) continue;
        // 下子
        if(MakeAMove(situation, move)){
            value = -MAX_VALUE + step;
        }
        else{
            if(PVflag){
                value = -SearchCut(situation, depth - 1, -alpha);
                if(value > alpha && value < beta)
                    value = -PVSearch(situation, depth - 1, -beta, -alpha, inspire_move);
            }
            else
                value = -PVSearch(situation, depth - 1, -beta, -alpha, inspire_move);
        }
        // 回溯
        UnMakeAMove(situation);

        // 当前为beta结点，执行剪枝
        if(value >= beta){
            // inspire = move;
            // 此着法是好着法，记录进历史表和杀手表
            SetBestMove(move, step, depth);
            SaveHashTable(depth, beta, hashBETA, move);
            return beta;
        }
        if(value > best){
            best = value;           // 更新最佳分数
            good_move = move;       // 更新最佳着法
            inspire = good_move;
            if(value > alpha){
                isAlpha = false;
                PVflag = true;
                alpha = value;
            }
        }
    }

    // 当前结点为alpha结点
    if(isAlpha){
        SaveHashTable(depth, alpha, hashALPHA, good_move);
    }
    // 当前结点为PV结点
    else{
        // 将PV结点中的最好着法，记录进历史表和杀手表
        SetBestMove(good_move, step, depth);
        SaveHashTable(depth, best, hashEXACT, good_move);
    }
    return alpha;
}